

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sed_lb_ed_test.cc
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  double computed_results;
  Node<label::StringLabel> t2;
  Node<label::StringLabel> t1;
  BracketNotationParser<label::StringLabel> bnp;
  double correct_result;
  string input_tree_2_string;
  string input_tree_1_string;
  string line;
  TreeIndexSED ti2;
  TreeIndexSED ti1;
  SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED> sed_algorithm;
  istream local_288 [8];
  ifstream test_cases_file;
  UnitCostModelLD<label::StringLabel> local_70;
  CostModel ucm;
  LabelDictionary ld;
  
  ld._84_4_ = 0;
  label::LabelDictionary<label::StringLabel>::LabelDictionary
            ((LabelDictionary<label::StringLabel> *)&ucm);
  cost_model::UnitCostModelLD<label::StringLabel>::UnitCostModelLD
            (&local_70,(LabelDictionary<label::StringLabel> *)&ucm);
  std::ifstream::ifstream(local_288,"sed_lb_ed_test_data.txt",8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error while opening file.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    ld._84_4_ = 0xffffffff;
  }
  else {
    ted_lb::SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>::
    TEDAlgorithm((SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>
                  *)&ti1.super_PostLToLabelId.postl_to_label_id_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage,&local_70);
    node::TreeIndexSED::TreeIndexSED
              ((TreeIndexSED *)
               &ti2.super_PostLToLabelId.postl_to_label_id_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    node::TreeIndexSED::TreeIndexSED((TreeIndexSED *)((long)&line.field_2 + 8));
    std::__cxx11::string::string((string *)(input_tree_1_string.field_2._M_local_buf + 8));
    do {
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_288,(string *)(input_tree_1_string.field_2._M_local_buf + 8));
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) {
          sed_algorithm.
          super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
          subproblem_counter_._4_4_ = 2;
          goto LAB_00103f05;
        }
        pcVar5 = (char *)std::__cxx11::string::operator[]
                                   ((ulong)((long)&input_tree_1_string.field_2 + 8));
      } while (*pcVar5 != '#');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(input_tree_1_string.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)(input_tree_2_string.field_2._M_local_buf + 8),
                 (string *)(input_tree_1_string.field_2._M_local_buf + 8));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(input_tree_1_string.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)&correct_result,(string *)(input_tree_1_string.field_2._M_local_buf + 8))
      ;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(input_tree_1_string.field_2._M_local_buf + 8));
      dVar6 = std::__cxx11::stod((string *)((long)&input_tree_1_string.field_2 + 8),(size_t *)0x0);
      parser::BracketNotationParser<label::StringLabel>::BracketNotationParser
                ((BracketNotationParser<label::StringLabel> *)((long)&t1.label_.label_.field_2 + 8))
      ;
      bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                        ((BracketNotationParser<label::StringLabel> *)
                         ((long)&t1.label_.label_.field_2 + 8),
                         (string *)((long)&input_tree_2_string.field_2 + 8));
      if (bVar2) {
        bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                          ((BracketNotationParser<label::StringLabel> *)
                           ((long)&t1.label_.label_.field_2 + 8),(string *)&correct_result);
        if (bVar2) {
          parser::BracketNotationParser<label::StringLabel>::parse_single
                    ((Node<label::StringLabel> *)((long)&t2.label_.label_.field_2 + 8),
                     (BracketNotationParser<label::StringLabel> *)
                     ((long)&t1.label_.label_.field_2 + 8),
                     (string *)((long)&input_tree_2_string.field_2 + 8));
          parser::BracketNotationParser<label::StringLabel>::parse_single
                    ((Node<label::StringLabel> *)&computed_results,
                     (BracketNotationParser<label::StringLabel> *)
                     ((long)&t1.label_.label_.field_2 + 8),(string *)&correct_result);
          node::
          index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                    ((TreeIndexSED *)
                     &ti2.super_PostLToLabelId.postl_to_label_id_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,
                     (Node<label::StringLabel> *)((long)&t2.label_.label_.field_2 + 8),
                     (LabelDictionary<label::StringLabel> *)&ucm,&local_70);
          node::
          index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                    ((TreeIndexSED *)((long)&line.field_2 + 8),
                     (Node<label::StringLabel> *)&computed_results,
                     (LabelDictionary<label::StringLabel> *)&ucm,&local_70);
          dVar7 = ted_lb::
                  SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>
                  ::ted((SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>
                         *)&ti1.super_PostLToLabelId.postl_to_label_id_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                        (TreeIndexSED *)
                        &ti2.super_PostLToLabelId.postl_to_label_id_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (TreeIndexSED *)((long)&line.field_2 + 8));
          if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect SED result: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
            poVar3 = std::operator<<(poVar3," instead of ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     (string *)(input_tree_2_string.field_2._M_local_buf + 8));
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&correct_result);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            ld._84_4_ = 0xffffffff;
            sed_algorithm.
            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
            subproblem_counter_._4_4_ = 1;
          }
          else {
            sed_algorithm.
            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
            subproblem_counter_._4_4_ = 0;
          }
          node::Node<label::StringLabel>::~Node((Node<label::StringLabel> *)&computed_results);
          node::Node<label::StringLabel>::~Node
                    ((Node<label::StringLabel> *)((long)&t2.label_.label_.field_2 + 8));
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect format of destination tree: \'")
          ;
          poVar3 = std::operator<<(poVar3,(string *)&correct_result);
          poVar3 = std::operator<<(poVar3,"\'. Is the number of opening and closing brackets equal?"
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          ld._84_4_ = 0xffffffff;
          sed_algorithm.
          super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
          subproblem_counter_._4_4_ = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect format of source tree: \'");
        poVar3 = std::operator<<(poVar3,(string *)(input_tree_2_string.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,"\'. Is the number of opening and closing brackets equal?");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        ld._84_4_ = 0xffffffff;
        sed_algorithm.
        super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
        subproblem_counter_._4_4_ = 1;
      }
      parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser
                ((BracketNotationParser<label::StringLabel> *)((long)&t1.label_.label_.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)&correct_result);
      std::__cxx11::string::~string((string *)(input_tree_2_string.field_2._M_local_buf + 8));
    } while (sed_algorithm.
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>
             .subproblem_counter_._4_4_ == 0);
LAB_00103f05:
    std::__cxx11::string::~string((string *)(input_tree_1_string.field_2._M_local_buf + 8));
    if (sed_algorithm.
        super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
        subproblem_counter_._4_4_ == 2) {
      ld._84_4_ = 0;
    }
    node::TreeIndexSED::~TreeIndexSED((TreeIndexSED *)((long)&line.field_2 + 8));
    node::TreeIndexSED::~TreeIndexSED
              ((TreeIndexSED *)
               &ti2.super_PostLToLabelId.postl_to_label_id_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  std::ifstream::~ifstream(local_288);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary
            ((LabelDictionary<label::StringLabel> *)&ucm);
  return ld._84_4_;
}

Assistant:

int main() {

  // Type aliases.
  using Label = label::StringLabel;
  using CostModel = cost_model::UnitCostModelLD<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  
  // Initialise label dictionary - separate dictionary for each test tree
  // becuse it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialise cost model.
  CostModel ucm(ld);

  // Parse test cases from file.
  std::ifstream test_cases_file("sed_lb_ed_test_data.txt");
  if (!test_cases_file.is_open()) {
    std::cerr << "Error while opening file." << std::endl;
    return -1;
  }

  // Initialise String Edit Distance algorithm.
  ted_lb::SEDTreeIndex<CostModel, node::TreeIndexSED> sed_algorithm(ucm);
  
  // Initialise two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  node::TreeIndexSED ti1;
  node::TreeIndexSED ti2;

  // Read test cases from a file line by line.
  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      // Read the single test case.
      std::getline(test_cases_file, line);
      std::string input_tree_1_string = line;
      std::getline(test_cases_file, line);
      std::string input_tree_2_string = line;
      std::getline(test_cases_file, line);
      double correct_result = std::stod(line);

      parser::BracketNotationParser<Label> bnp;

      // Validate test trees.
      if (!bnp.validate_input(input_tree_1_string)) {
        std::cerr << "Incorrect format of source tree: '" << input_tree_1_string << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      if (!bnp.validate_input(input_tree_2_string)) {
        std::cerr << "Incorrect format of destination tree: '" << input_tree_2_string << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      node::Node<Label> t1 = bnp.parse_single(input_tree_1_string);
      node::Node<Label> t2 = bnp.parse_single(input_tree_2_string);

      // Index input trees.
      node::index_tree(ti1, t1, ld, ucm);
      node::index_tree(ti2, t2, ld, ucm);

      // Execute the algorithm.
      double computed_results = sed_algorithm.ted(ti1, ti2);

      if (correct_result != computed_results) {
        std::cerr << "Incorrect SED result: " << computed_results << " instead of " << correct_result << std::endl;
        std::cerr << input_tree_1_string << std::endl;
        std::cerr << input_tree_2_string << std::endl;
        return -1;
      }
    }
  }

  return 0;
}